

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError oct2nummax(long *val,char *str,long max)

{
  ParameterError result;
  long max_local;
  char *str_local;
  long *val_local;
  
  val_local._4_4_ = getnum(val,str,8);
  if (val_local._4_4_ == PARAM_OK) {
    if (max < *val) {
      val_local._4_4_ = PARAM_NUMBER_TOO_LARGE;
    }
    else if (*val < 0) {
      val_local._4_4_ = PARAM_NEGATIVE_NUMERIC;
    }
    else {
      val_local._4_4_ = PARAM_OK;
    }
  }
  return val_local._4_4_;
}

Assistant:

ParameterError oct2nummax(long *val, const char *str, long max)
{
  ParameterError result = getnum(val, str, 8);
  if(result != PARAM_OK)
    return result;
  else if(*val > max)
    return PARAM_NUMBER_TOO_LARGE;
  else if(*val < 0)
    return PARAM_NEGATIVE_NUMERIC;

  return PARAM_OK;
}